

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

bool llvm::consumeUnsignedInteger(StringRef *Str,uint Radix,unsigned_long_long *Result)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  StringRef Prefix;
  StringRef Prefix_00;
  StringRef Prefix_01;
  StringRef Prefix_02;
  StringRef Prefix_03;
  StringRef local_48;
  
  if (Radix != 0) goto LAB_00dc4f47;
  Radix = 10;
  if (Str->Length == 0) goto LAB_00dc4f47;
  uVar7 = 2;
  Prefix.Length = 2;
  Prefix.Data = "0x";
  bVar1 = StringRef::startswith(Str,Prefix);
  if (bVar1) {
LAB_00dc4f2a:
    uVar4 = Str->Length;
    if (uVar4 < 2) {
      uVar7 = uVar4;
    }
    sVar3 = uVar4 - uVar7;
    pcVar6 = Str->Data + uVar7;
    Radix = 0x10;
  }
  else {
    Prefix_00.Length = 2;
    Prefix_00.Data = "0X";
    bVar1 = StringRef::startswith(Str,Prefix_00);
    if (bVar1) goto LAB_00dc4f2a;
    Prefix_01.Length = 2;
    Prefix_01.Data = "0b";
    bVar1 = StringRef::startswith(Str,Prefix_01);
    if (bVar1) {
LAB_00dc5078:
      uVar4 = Str->Length;
      if (uVar4 < 2) {
        uVar7 = uVar4;
      }
      sVar3 = uVar4 - uVar7;
      pcVar6 = Str->Data + uVar7;
      Radix = 2;
    }
    else {
      Prefix_02.Length = 2;
      Prefix_02.Data = "0B";
      bVar1 = StringRef::startswith(Str,Prefix_02);
      if (bVar1) goto LAB_00dc5078;
      Prefix_03.Length = 2;
      Prefix_03.Data = "0o";
      bVar1 = StringRef::startswith(Str,Prefix_03);
      if (bVar1) {
        uVar4 = Str->Length;
        if (uVar4 < 2) {
          uVar7 = uVar4;
        }
      }
      else {
        cVar2 = StringRef::operator[](Str,0);
        if ((cVar2 != '0') || (Str->Length < 2)) goto LAB_00dc4f47;
        cVar2 = StringRef::operator[](Str,1);
        if (9 < (byte)(cVar2 - 0x30U)) goto LAB_00dc4f47;
        uVar4 = Str->Length;
        uVar7 = (ulong)(uVar4 != 0);
      }
      sVar3 = uVar4 - uVar7;
      pcVar6 = Str->Data + uVar7;
      Radix = 8;
    }
  }
  Str->Data = pcVar6;
  Str->Length = sVar3;
LAB_00dc4f47:
  if (Str->Length == 0) {
LAB_00dc5020:
    bVar1 = true;
  }
  else {
    local_48.Data = Str->Data;
    local_48.Length = Str->Length;
    *Result = 0;
    for (; local_48.Length != 0; local_48.Length = local_48.Length - (local_48.Length != 0)) {
      cVar2 = StringRef::operator[](&local_48,0);
      if (cVar2 < '0') {
LAB_00dc4f96:
        cVar2 = StringRef::operator[](&local_48,0);
        if ('`' < cVar2) {
          cVar2 = StringRef::operator[](&local_48,0);
          iVar5 = -0x57;
          if (cVar2 < '{') goto LAB_00dc4fd4;
        }
        cVar2 = StringRef::operator[](&local_48,0);
        if (cVar2 < 'A') break;
        cVar2 = StringRef::operator[](&local_48,0);
        iVar5 = -0x37;
        if ('Z' < cVar2) break;
      }
      else {
        cVar2 = StringRef::operator[](&local_48,0);
        iVar5 = -0x30;
        if ('9' < cVar2) goto LAB_00dc4f96;
      }
LAB_00dc4fd4:
      cVar2 = StringRef::operator[](&local_48,0);
      if (Radix <= (uint)(cVar2 + iVar5)) break;
      uVar7 = *Result;
      uVar4 = (ulong)(uint)(cVar2 + iVar5) + uVar7 * Radix;
      *Result = uVar4;
      if (uVar4 / Radix < uVar7) goto LAB_00dc5020;
      local_48.Data = local_48.Data + (local_48.Length != 0);
    }
    bVar1 = true;
    if (Str->Length != local_48.Length) {
      Str->Data = local_48.Data;
      Str->Length = local_48.Length;
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool llvm::consumeUnsignedInteger(StringRef &Str, unsigned Radix,
                                  unsigned long long &Result) {
  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Parse all the bytes of the string given this radix.  Watch for overflow.
  StringRef Str2 = Str;
  Result = 0;
  while (!Str2.empty()) {
    unsigned CharVal;
    if (Str2[0] >= '0' && Str2[0] <= '9')
      CharVal = Str2[0] - '0';
    else if (Str2[0] >= 'a' && Str2[0] <= 'z')
      CharVal = Str2[0] - 'a' + 10;
    else if (Str2[0] >= 'A' && Str2[0] <= 'Z')
      CharVal = Str2[0] - 'A' + 10;
    else
      break;

    // If the parsed value is larger than the integer radix, we cannot
    // consume any more characters.
    if (CharVal >= Radix)
      break;

    // Add in this character.
    unsigned long long PrevResult = Result;
    Result = Result * Radix + CharVal;

    // Check for overflow by shifting back and seeing if bits were lost.
    if (Result / Radix < PrevResult)
      return true;

    Str2 = Str2.substr(1);
  }

  // We consider the operation a failure if no characters were consumed
  // successfully.
  if (Str.size() == Str2.size())
    return true;

  Str = Str2;
  return false;
}